

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::CopyFrom(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
           *this,TPZMatrix<std::complex<double>_> *mat)

{
  int64_t iVar1;
  STensorProductMTData *pSVar2;
  undefined4 uVar3;
  TPZMatrix<std::complex<double>_> *cp;
  
  if (mat != (TPZMatrix<std::complex<double>_> *)0x0) {
    cp = (TPZMatrix<std::complex<double>_> *)
         __dynamic_cast(mat,&TPZMatrix<std::complex<double>>::typeinfo,
                        &TPZFrontMatrix<std::complex<double>,TPZStackEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>
                         ::typeinfo,0);
    if (cp != (TPZMatrix<std::complex<double>_> *)0x0) {
      TPZMatrix<std::complex<double>_>::operator=((TPZMatrix<std::complex<double>_> *)this,cp);
      TPZManVector<TPZEqnArray<std::complex<double>_>,_10>::operator=
                (&(this->fStorage).fEqnStack.
                  super_TPZManVector<TPZEqnArray<std::complex<double>_>,_10>,
                 (TPZManVector<TPZEqnArray<std::complex<double>_>,_10> *)
                 &cp[1].super_TPZBaseMatrix.fRow);
      uVar3 = *(undefined4 *)((long)&cp[0x1993].super_TPZBaseMatrix.fCol + 4);
      (this->fFront).super_TPZFront<std::complex<double>_>.fWork =
           *(undefined4 *)&cp[0x1993].super_TPZBaseMatrix.fCol;
      (this->fFront).super_TPZFront<std::complex<double>_>.fMaxFront = uVar3;
      TPZManVector<long,_10>::operator=
                (&(this->fFront).super_TPZFront<std::complex<double>_>.fGlobal,
                 (TPZManVector<long,_10> *)&cp[0x1993].super_TPZBaseMatrix.fDecomposed);
      TPZVec<long>::operator=
                (&(this->fFront).super_TPZFront<std::complex<double>_>.fLocal,
                 (TPZVec<long> *)&cp[0x1997].super_TPZBaseMatrix.fRow);
      iVar1 = cp[0x1998].super_TPZBaseMatrix.fCol;
      (this->fFront).super_TPZFront<std::complex<double>_>.fFront =
           cp[0x1998].super_TPZBaseMatrix.fRow;
      (this->fFront).super_TPZFront<std::complex<double>_>.fNextRigidBodyMode = iVar1;
      TPZManVector<int,_10>::operator=
                (&(this->fFront).super_TPZFront<std::complex<double>_>.fFree.
                  super_TPZManVector<int,_10>,
                 (TPZManVector<int,_10> *)&cp[0x1998].super_TPZBaseMatrix.fDecomposed);
      TPZVec<std::complex<double>_>::operator=
                (&(this->fFront).super_TPZFront<std::complex<double>_>.fData,
                 (TPZVec<std::complex<double>_> *)(cp + 0x199b));
      pSVar2 = (STensorProductMTData *)cp[0x199c].super_TPZBaseMatrix.fRow;
      *(_func_int ***)&(this->fFront).super_TPZFront<std::complex<double>_>.fExpandRatio =
           cp[0x199c].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      (this->fFront).super_TPZFront<std::complex<double>_>.fProductMTData = pSVar2;
      iVar1 = *(int64_t *)&cp[0x199c].super_TPZBaseMatrix.fDecomposed;
      this->fNumEq = cp[0x199c].super_TPZBaseMatrix.fCol;
      this->fLastDecomposed = iVar1;
      TPZVec<int>::operator=(&this->fNumElConnected,(TPZVec<int> *)(cp + 0x199d));
      TPZVec<int>::operator=(&this->fNumElConnectedBackup,(TPZVec<int> *)(cp + 0x199e));
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFrontMatrix<std::complex<double>, TPZStackEqnStorage<std::complex<double>>, TPZFrontSym<std::complex<double>>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<double>, store = TPZStackEqnStorage<std::complex<double>>, front = TPZFrontSym<std::complex<double>>]"
             ,0x11c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }